

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoSimdShuffle(Thread *this,Instr instr)

{
  Simd<unsigned_char,_(unsigned_char)__x10_> value;
  byte *pbVar1;
  uchar *puVar2;
  uchar local_71;
  byte local_51;
  undefined1 auStack_50 [7];
  u8 i;
  S result;
  Simd<unsigned_char,_(unsigned_char)__x10_> lhs;
  Simd<unsigned_char,_(unsigned_char)__x10_> rhs;
  Simd<unsigned_char,_(unsigned_char)__x10_> sel;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ =
       Bitcast<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,v128&>(&instr.field_2.imm_v128);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  for (local_51 = 0; local_51 < 0x10; local_51 = local_51 + 1) {
    pbVar1 = Simd<unsigned_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<unsigned_char,_(unsigned_char)__x10_> *)(rhs.v + 8),local_51);
    if (*pbVar1 < 0x10) {
      puVar2 = Simd<unsigned_char,_(unsigned_char)'\x10'>::operator[]
                         ((Simd<unsigned_char,_(unsigned_char)__x10_> *)(rhs.v + 8),local_51);
      puVar2 = Simd<unsigned_char,_(unsigned_char)'\x10'>::operator[]
                         ((Simd<unsigned_char,_(unsigned_char)__x10_> *)(result.v + 8),*puVar2);
      local_71 = *puVar2;
    }
    else {
      puVar2 = Simd<unsigned_char,_(unsigned_char)'\x10'>::operator[]
                         ((Simd<unsigned_char,_(unsigned_char)__x10_> *)(rhs.v + 8),local_51);
      puVar2 = Simd<unsigned_char,_(unsigned_char)'\x10'>::operator[]
                         ((Simd<unsigned_char,_(unsigned_char)__x10_> *)(lhs.v + 8),*puVar2 + 0xf0);
      local_71 = *puVar2;
    }
    puVar2 = Simd<unsigned_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<unsigned_char,_(unsigned_char)__x10_> *)auStack_50,local_51);
    *puVar2 = local_71;
  }
  value.v[8] = result.v[0];
  value.v[9] = result.v[1];
  value.v[10] = result.v[2];
  value.v[0xb] = result.v[3];
  value.v[0xc] = result.v[4];
  value.v[0xd] = result.v[5];
  value.v[0xe] = result.v[6];
  value.v[0xf] = result.v[7];
  value.v[0] = auStack_50[0];
  value.v[1] = auStack_50[1];
  value.v[2] = auStack_50[2];
  value.v[3] = auStack_50[3];
  value.v[4] = auStack_50[4];
  value.v[5] = auStack_50[5];
  value.v[6] = auStack_50[6];
  value.v[7] = i;
  Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShuffle(Instr instr) {
  using S = u8x16;
  auto sel = Bitcast<S>(instr.imm_v128);
  auto rhs = Pop<S>();
  auto lhs = Pop<S>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = sel[i] < S::lanes ? lhs[sel[i]] : rhs[sel[i] - S::lanes];
  }
  Push(result);
  return RunResult::Ok;
}